

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

void __thiscall
DepfileParserTestUnifyMultipleRulesLF::Run(DepfileParserTestUnifyMultipleRulesLF *this)

{
  Test *pTVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  undefined4 local_40;
  undefined1 local_30 [8];
  string err;
  DepfileParserTestUnifyMultipleRulesLF *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  pTVar1 = g_current_test;
  bVar2 = DepfileParserTest::Parse
                    (&this->super_DepfileParserTest,"foo: x\nfoo: y\nfoo \\\nfoo: z\n",
                     (string *)local_30);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
             ,0xfb,"Parse(\"foo: x\\n\" \"foo: y\\n\" \"foo \\\\\\n\" \"foo: z\\n\", &err)");
  pTVar1 = g_current_test;
  sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                    (&(this->super_DepfileParserTest).parser_.outs_);
  bVar2 = testing::Test::Check
                    (pTVar1,sVar3 == 1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                     ,0xfc,"1u == parser_.outs_.size()");
  pTVar1 = g_current_test;
  if (bVar2) {
    pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                       (&(this->super_DepfileParserTest).parser_.outs_,0);
    StringPiece::AsString_abi_cxx11_(&local_60,pvVar4);
    bVar2 = std::operator==("foo",&local_60);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                       ,0xfd,"\"foo\" == parser_.outs_[0].AsString()");
    std::__cxx11::string::~string((string *)&local_60);
    pTVar1 = g_current_test;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                        (&(this->super_DepfileParserTest).parser_.ins_);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar3 == 3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                         ,0xfe,"3u == parser_.ins_.size()");
      pTVar1 = g_current_test;
      if (bVar2) {
        pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           (&(this->super_DepfileParserTest).parser_.ins_,0);
        StringPiece::AsString_abi_cxx11_(&local_80,pvVar4);
        bVar2 = std::operator==("x",&local_80);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                   ,0xff,"\"x\" == parser_.ins_[0].AsString()");
        std::__cxx11::string::~string((string *)&local_80);
        pTVar1 = g_current_test;
        pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           (&(this->super_DepfileParserTest).parser_.ins_,1);
        StringPiece::AsString_abi_cxx11_(&local_a0,pvVar4);
        bVar2 = std::operator==("y",&local_a0);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                   ,0x100,"\"y\" == parser_.ins_[1].AsString()");
        std::__cxx11::string::~string((string *)&local_a0);
        pTVar1 = g_current_test;
        pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           (&(this->super_DepfileParserTest).parser_.ins_,2);
        StringPiece::AsString_abi_cxx11_(&local_c0,pvVar4);
        bVar2 = std::operator==("z",&local_c0);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                   ,0x101,"\"z\" == parser_.ins_[2].AsString()");
        std::__cxx11::string::~string((string *)&local_c0);
        local_40 = 0;
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_40 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_40 = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    local_40 = 1;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(DepfileParserTest, UnifyMultipleRulesLF) {
  string err;
  EXPECT_TRUE(Parse("foo: x\n"
                    "foo: y\n"
                    "foo \\\n"
                    "foo: z\n", &err));
  ASSERT_EQ(1u, parser_.outs_.size());
  ASSERT_EQ("foo", parser_.outs_[0].AsString());
  ASSERT_EQ(3u, parser_.ins_.size());
  EXPECT_EQ("x", parser_.ins_[0].AsString());
  EXPECT_EQ("y", parser_.ins_[1].AsString());
  EXPECT_EQ("z", parser_.ins_[2].AsString());
}